

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O3

void fy_diag_cfg_from_parser_flags(fy_diag_cfg *cfg,fy_parse_cfg_flags pflags)

{
  cfg->level = pflags >> 0xc & 0xf;
  cfg->module_mask = pflags >> 4 & 0xff;
  cfg->field_0x20 = (byte)(pflags >> 0xf) & 0x1e | cfg->field_0x20 & 0xe0;
  return;
}

Assistant:

void fy_diag_cfg_from_parser_flags(struct fy_diag_cfg *cfg, enum fy_parse_cfg_flags pflags) {
    cfg->level = (pflags >> FYPCF_DEBUG_LEVEL_SHIFT) & FYPCF_DEBUG_LEVEL_MASK;
    cfg->module_mask = (pflags >> FYPCF_MODULE_SHIFT) & FYPCF_MODULE_MASK;
    cfg->colorize = false;
    cfg->show_source = !!(pflags & FYPCF_DEBUG_DIAG_SOURCE);
    cfg->show_position = !!(pflags & FYPCF_DEBUG_DIAG_POSITION);
    cfg->show_type = !!(pflags & FYPCF_DEBUG_DIAG_TYPE);
    cfg->show_module = !!(pflags & FYPCF_DEBUG_DIAG_MODULE);
}